

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

ErrorOr<llvm::sys::fs::perms> *
llvm::sys::fs::getPermissions(ErrorOr<llvm::sys::fs::perms> *__return_storage_ptr__,Twine *Path)

{
  error_code EC;
  error_code eVar1;
  perms local_54;
  file_status local_50;
  
  local_50.super_basic_file_status.Perms = perms_not_known;
  eVar1 = status(Path,&local_50,true);
  EC._M_cat = eVar1._M_cat;
  if (eVar1._M_value == 0) {
    local_54 = local_50.super_basic_file_status.Perms;
    ErrorOr<llvm::sys::fs::perms>::ErrorOr<llvm::sys::fs::perms>
              (__return_storage_ptr__,&local_54,(type *)0x0);
  }
  else {
    EC._4_4_ = 0;
    EC._M_value = eVar1._M_value;
    ErrorOr<llvm::sys::fs::perms>::ErrorOr(__return_storage_ptr__,EC);
  }
  return __return_storage_ptr__;
}

Assistant:

ErrorOr<perms> getPermissions(const Twine &Path) {
  file_status Status;
  if (std::error_code EC = status(Path, Status))
    return EC;

  return Status.permissions();
}